

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

IString __thiscall wasm::Wasm2JSBuilder::fromName(Wasm2JSBuilder *this,Name name,NameScope scope)

{
  char **this_00;
  string_view sVar1;
  iterator this_01;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  _Node_iterator_base<wasm::IString,_true> _Var5;
  size_type sVar6;
  mapped_type *this_02;
  __node_type *this_03;
  Name name_00;
  IString IVar7;
  pair<std::__detail::_Node_iterator<wasm::IString,_true,_true>,_bool> pVar8;
  const_pointer local_298;
  _Node_iterator_base<wasm::IString,_true> local_290;
  undefined1 local_288;
  int local_27c;
  string local_278;
  IString local_258;
  string local_248 [32];
  string local_228 [8];
  string mangled;
  ostringstream local_1e8 [8];
  ostringstream out;
  int local_6c;
  int i;
  unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
  *topMangledNames;
  unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
  *scopeMangledNames;
  const_pointer local_50;
  _Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false> local_48;
  iterator it;
  unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
  *map;
  NameScope scope_local;
  Wasm2JSBuilder *this_local;
  Name name_local;
  IString ret;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  it.super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>)
       (_Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>)
       (this->wasmNameToMangledName + (int)scope);
  local_50 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
       ::find((unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
               *)(this->wasmNameToMangledName + (int)scope),&local_50);
  scopeMangledNames =
       (unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
        *)std::
          unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
          ::end((unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
                 *)it.super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>.
                   _M_cur);
  bVar2 = std::__detail::operator!=
                    (&local_48,
                     (_Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false> *)
                     &scopeMangledNames);
  if (!bVar2) {
    this_03 = (__node_type *)(this->mangledNames + (int)scope);
    _Var5._M_cur = this_03;
    IString::IString((IString *)&name_local.super_IString.str._M_str);
    local_6c = 0;
    do {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      name_00.super_IString.str._M_str = (char *)_Var5._M_cur;
      name_00.super_IString.str._M_len = name_local.super_IString.str._M_len;
      wasm::operator<<((wasm *)local_1e8,(ostream *)this_local,name_00);
      if (0 < local_6c) {
        poVar4 = std::operator<<((ostream *)local_1e8,"_");
        std::ostream::operator<<(poVar4,local_6c);
      }
      std::__cxx11::ostringstream::str();
      ::wasm::asmangle(local_228,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::string((string *)&local_278,local_228);
      IVar7 = stringToIString(&local_278);
      local_258.str._M_str = IVar7.str._M_str;
      _Var5._M_cur = (__node_type *)IVar7.str._M_len;
      this_00 = &name_local.super_IString.str._M_str;
      local_258.str._M_len = (size_t)_Var5._M_cur;
      IString::operator=((IString *)this_00,&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      sVar6 = std::
              unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
              ::count((unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
                       *)this_03,(key_type *)this_00);
      if (sVar6 == 0) {
        if (scope == Local) {
          sVar6 = std::
                  unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
                  ::count(this->mangledNames + 1,(key_type *)&name_local.super_IString.str._M_str);
          if (sVar6 != 0) {
            local_27c = 4;
            goto LAB_0020848a;
          }
        }
        pVar8 = std::
                unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
                ::insert((unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
                          *)this_03,(value_type *)&name_local.super_IString.str._M_str);
        this_01 = it;
        _Var5._M_cur = (__node_type *)
                       pVar8.first.super__Node_iterator_base<wasm::IString,_true>._M_cur;
        local_288 = pVar8.second;
        local_290._M_cur = _Var5._M_cur;
        local_298 = std::basic_string_view<char,_std::char_traits<char>_>::data
                              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        this_02 = std::
                  unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
                  ::operator[]((unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
                                *)this_01.
                                  super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>
                                  ._M_cur,&local_298);
        IString::operator=(this_02,(IString *)&name_local.super_IString.str._M_str);
        local_27c = 1;
      }
      else {
        if (scope == Export) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "wasm2js: warning: export names colliding: ");
          poVar4 = std::operator<<(poVar4,local_228);
          std::operator<<(poVar4,'\n');
        }
        local_27c = 4;
      }
LAB_0020848a:
      std::__cxx11::string::~string(local_228);
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
      if (local_27c == 1) goto LAB_002084d9;
      local_6c = local_6c + 1;
    } while( true );
  }
  ppVar3 = std::__detail::_Node_iterator<std::pair<const_void_*const,_wasm::IString>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_void_*const,_wasm::IString>,_false,_false> *
                        )&local_48);
  name_local.super_IString.str._M_str = (char *)(ppVar3->second).str._M_len;
  ret.str._M_len = (size_t)(ppVar3->second).str._M_str;
LAB_002084d9:
  sVar1._M_str = (char *)ret.str._M_len;
  sVar1._M_len = (size_t)name_local.super_IString.str._M_str;
  return (IString)sVar1;
}

Assistant:

IString fromName(Name name, NameScope scope) {
    // TODO: checking names do not collide after mangling

    // First up check our cached of mangled names to avoid doing extra work
    // below
    auto& map = wasmNameToMangledName[(int)scope];
    auto it = map.find(name.str.data());
    if (it != map.end()) {
      return it->second;
    }
    // The mangled names in our scope.
    auto& scopeMangledNames = mangledNames[(int)scope];
    // In some cases (see below) we need to also check the Top scope.
    auto& topMangledNames = mangledNames[int(NameScope::Top)];

    // This is the first time we've seen the `name` and `scope` pair. Generate a
    // globally unique name based on `name` and then register that in our cache
    // and return it.
    //
    // Identifiers here generated are of the form `${name}_${n}` where `_${n}`
    // is omitted if `n==0` and otherwise `n` is just looped over to find the
    // next unused identifier.
    IString ret;
    for (int i = 0;; i++) {
      std::ostringstream out;
      out << name;
      if (i > 0) {
        out << "_" << i;
      }
      auto mangled = asmangle(out.str());
      ret = stringToIString(mangled);
      if (scopeMangledNames.count(ret)) {
        // When export names collide things may be confusing, as this is
        // observable externally by the person using the JS. Report a warning.
        if (scope == NameScope::Export) {
          std::cerr << "wasm2js: warning: export names colliding: " << mangled
                    << '\n';
        }
        continue;
      }
      // The Local scope is special: a Local name must not collide with a Top
      // name, as they are in a single namespace in JS and can conflict:
      //
      // function foo(bar) {
      //   var bar = 0;
      // }
      // function bar() { ..
      if (scope == NameScope::Local && topMangledNames.count(ret)) {
        continue;
      }
      // We found a good name, use it.
      scopeMangledNames.insert(ret);
      map[name.str.data()] = ret;
      return ret;
    }
  }